

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_json_schema.cpp
# Opt level: O2

void __thiscall
flatbuffers::jsons::JsonSchemaGenerator::JsonSchemaGenerator
          (JsonSchemaGenerator *this,Parser *parser,string *path,string *file_name)

{
  allocator<char> local_8b;
  allocator<char> local_8a;
  allocator<char> local_89;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_89);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_8a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"json",&local_8b);
  BaseGenerator::BaseGenerator
            (&this->super_BaseGenerator,parser,path,file_name,&local_68,&local_88,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  (this->super_BaseGenerator)._vptr_BaseGenerator = (_func_int **)&PTR_generate_002fb618;
  (this->code_)._M_dataplus._M_p = (pointer)&(this->code_).field_2;
  (this->code_)._M_string_length = 0;
  (this->code_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

JsonSchemaGenerator(const Parser &parser, const std::string &path,
                      const std::string &file_name)
      : BaseGenerator(parser, path, file_name, "", "", "json") {}